

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_grail_merge_left(int **arr,int L1,int L2,int M)

{
  int in_ECX;
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int p1;
  int p0;
  int **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 0;
  iVar2 = in_ESI;
  local_14 = in_ECX;
  while (iVar2 < in_ESI + in_EDX) {
    if ((local_18 == in_ESI) ||
       (0 < **(int **)(in_RDI + (long)local_18 * 8) - **(int **)(in_RDI + (long)iVar2 * 8))) {
      iVar1 = iVar2 + 1;
      stable_grail_swap1((int **)(in_RDI + (long)local_14 * 8),(int **)(in_RDI + (long)iVar2 * 8));
      iVar2 = iVar1;
    }
    else {
      stable_grail_swap1((int **)(in_RDI + (long)local_14 * 8),(int **)(in_RDI + (long)local_18 * 8)
                        );
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  if (local_14 != local_18) {
    stable_grail_swap_n((int **)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                        0);
  }
  return;
}

Assistant:

static void GRAIL_MERGE_LEFT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = 0, p1 = L1;
  L2 += L1;

  while (p1 < L2) {
    if (p0 == L1 || SORT_CMP_A(arr + p0, arr + p1) > 0) {
      GRAIL_SWAP1(arr + (M++), arr + (p1++));
    } else {
      GRAIL_SWAP1(arr + (M++), arr + (p0++));
    }
  }

  if (M != p0) {
    GRAIL_SWAP_N(arr + M, arr + p0, L1 - p0);
  }
}